

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

int32_t internal_exr_compute_chunk_offset_size(exr_priv_part_t curpart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  exr_attr_chlist_t *peVar5;
  exr_attr_tiledesc_t *peVar6;
  exr_attr_chlist_entry_t *peVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int32_t iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  int16_t iVar22;
  long lVar23;
  uint64_t uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  bool bVar28;
  
  if (curpart->storage_mode == EXR_STORAGE_UNKNOWN) {
    if (0 < curpart->chunk_count) {
      return curpart->chunk_count;
    }
    return 0;
  }
  peVar5 = (curpart->channels->field_6).chlist;
  if (curpart->tiles == (exr_attribute_t *)0x0) {
    iVar12 = (curpart->data_window).min.y;
    iVar1 = (curpart->data_window).max.y;
    iVar2 = (curpart->data_window).min.x;
    iVar3 = (curpart->data_window).max.x;
    uVar10 = exr_compression_lines_per_chunk(curpart->comp_type);
    curpart->lines_per_chunk = (int16_t)uVar10;
    if ((int)uVar10 < 0) {
      iVar12 = 0;
    }
    else {
      iVar22 = 0;
      if ((long)peVar5->num_channels < 1) {
        uVar24 = 0;
      }
      else {
        iVar20 = (iVar3 - iVar2) + 1;
        peVar7 = peVar5->entries;
        uVar13 = (iVar12 + uVar10) - 1;
        uVar16 = 1 - (uVar10 + iVar12);
        if (0 < (int)(uVar10 + iVar12)) {
          uVar16 = uVar13;
        }
        lVar19 = 0;
        uVar24 = 0;
        iVar22 = 0;
        do {
          iVar17 = *(int *)(peVar7->reserved + lVar19 + 3);
          uVar4 = *(uint *)(peVar7->reserved + lVar19 + 7);
          iVar11 = 1;
          if (iVar17 < 2) {
            iVar11 = iVar20;
          }
          if (1 < iVar17 && iVar3 != iVar2) {
            iVar11 = iVar20 / iVar17;
          }
          uVar14 = uVar10;
          if (1 < (int)uVar4) {
            iVar17 = iVar12 % (int)uVar4;
            if (uVar10 == 1) {
              uVar14 = (uint)(iVar17 == 0);
            }
            else {
              iVar26 = uVar4 - iVar17;
              if (iVar17 == 0) {
                iVar26 = 0;
              }
              uVar14 = 0;
              iVar17 = uVar13 - uVar16 % uVar4;
              if (iVar26 + iVar12 <= iVar17) {
                uVar14 = (iVar17 - (iVar26 + iVar12)) / (int)uVar4 + 1;
              }
            }
          }
          if (1 < (int)uVar4) {
            iVar22 = 1;
          }
          uVar24 = uVar24 + ((long)iVar11 <<
                            (2U - (*(int *)(peVar7->reserved + lVar19 + -5) == 1) & 0x3f)) *
                            (long)(int)uVar14;
          lVar19 = lVar19 + 0x20;
        } while ((long)peVar5->num_channels * 0x20 != lVar19);
      }
      curpart->unpacked_size_per_chunk = uVar24;
      curpart->chan_has_line_sampling = iVar22;
      iVar12 = (int)((iVar1 - iVar12) + uVar10) / (int)uVar10;
    }
    if (-1 < (int)uVar10) {
      return iVar12;
    }
    return -1;
  }
  peVar6 = (curpart->tiles->field_6).tiledesc;
  bVar15 = peVar6->level_and_round & 0xf;
  iVar18 = 0;
  if (bVar15 < 2) {
    iVar18 = 0;
    if ((long)curpart->num_tile_levels_x < 1) {
      lVar19 = 0;
    }
    else {
      lVar23 = 0;
      lVar19 = 0;
      do {
        lVar19 = lVar19 + (long)curpart->tile_level_tile_count_y[lVar23] *
                          (long)curpart->tile_level_tile_count_x[lVar23];
        lVar23 = lVar23 + 1;
      } while (curpart->num_tile_levels_x != lVar23);
    }
    bVar8 = false;
    if (0x7fffffff < lVar19) goto LAB_0012664e;
  }
  else {
    bVar8 = false;
    if (bVar15 != 2) goto LAB_0012664e;
    uVar21 = (ulong)curpart->num_tile_levels_x;
    iVar18 = 0;
    bVar28 = 0 < (long)uVar21;
    if ((long)uVar21 < 1) {
      lVar19 = 0;
    }
    else {
      uVar10 = curpart->num_tile_levels_y;
      lVar23 = (long)(int)uVar10;
      uVar25 = 0;
      lVar19 = 0;
      do {
        bVar8 = 0 < lVar23;
        if (0 < (int)uVar10) {
          lVar19 = (long)*curpart->tile_level_tile_count_y *
                   (long)curpart->tile_level_tile_count_x[uVar25] + lVar19;
          if (lVar19 < 0x80000000) {
            uVar9 = 1;
            do {
              uVar27 = uVar9;
              if (uVar10 == uVar27) break;
              lVar19 = lVar19 + (long)curpart->tile_level_tile_count_y[uVar27] *
                                (long)curpart->tile_level_tile_count_x[uVar25];
              uVar9 = uVar27 + 1;
            } while (lVar19 < 0x80000000);
            bVar8 = (long)uVar27 < lVar23;
          }
        }
        if (bVar8) break;
        uVar25 = uVar25 + 1;
        bVar28 = uVar25 < uVar21;
      } while (uVar25 != uVar21);
    }
    bVar8 = false;
    if (bVar28) goto LAB_0012664e;
  }
  if ((long)peVar5->num_channels < 1) {
    uVar24 = 0;
  }
  else {
    lVar23 = 0;
    uVar24 = 0;
    do {
      uVar24 = uVar24 + ((ulong)peVar6->x_size <<
                        (2U - (*(int *)(peVar5->entries->reserved + lVar23 + -5) == 1) & 0x3f)) *
                        (ulong)peVar6->y_size;
      lVar23 = lVar23 + 0x20;
    } while ((long)peVar5->num_channels * 0x20 != lVar23);
  }
  curpart->unpacked_size_per_chunk = uVar24;
  curpart->chan_has_line_sampling = 0;
  bVar8 = true;
  iVar18 = (int32_t)lVar19;
LAB_0012664e:
  if (bVar8) {
    return iVar18;
  }
  return -1;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (exr_priv_part_t curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    if (curpart->storage_mode == EXR_STORAGE_UNKNOWN)
    {
        if (curpart->chunk_count > 0)
            return curpart->chunk_count;
        return 0;
    }

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            /* tiles do not allow x/y sub sampling */
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) tiledesc->x_size;
            cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        int linePerChunk, h;

        linePerChunk = exr_compression_lines_per_chunk (curpart->comp_type);

        curpart->lines_per_chunk = linePerChunk;

        if (linePerChunk < 0) return -1;

        for (int c = 0; c < channels->num_channels; ++c)
        {
            int xsamp  = channels->entries[c].x_sampling;
            int ysamp  = channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) compute_sampled_width (w, xsamp, dw.min.x);
            cunpsz *= (uint64_t) compute_sampled_height (linePerChunk, ysamp, dw.min.y);
            if (ysamp > 1)
                hasLineSample = 1;
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}